

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofRAngle.cpp
# Opt level: O3

RealType __thiscall
OpenMD::GofRTheta::evaluateAngle(GofRTheta *this,StuntDouble *sd1,StuntDouble *sd2)

{
  double *pdVar1;
  undefined4 *puVar2;
  double dVar3;
  char cVar4;
  double dVar5;
  bool bVar6;
  uint i_1;
  ObjectType OVar7;
  double **ppdVar8;
  uint i;
  long lVar9;
  double **ppdVar10;
  long lVar11;
  double (*padVar12) [3];
  double tmp;
  Vector<double,_3U> result_2;
  Vector<double,_3U> result;
  MultipoleAdapter ma1;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 local_138;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined8 local_128;
  Vector3d local_118;
  double *local_f8;
  double dStack_f0;
  double local_e8 [8];
  double local_a8 [4];
  double local_88 [4];
  MultipoleAdapter local_68;
  double local_60 [9];
  
  cVar4 = (((this->super_GofRAngle).super_RadialDistrFunc.super_StaticAnalyser.info_)->simParams_->
          UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  lVar9 = *(long *)((long)&(sd1->snapshotMan_->currentSnapshot_->atomData).position.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + sd1->storage_);
  local_88[2] = (double)*(undefined8 *)(lVar9 + 0x10 + (long)sd1->localIndex_ * 0x18);
  pdVar1 = (double *)(lVar9 + (long)sd1->localIndex_ * 0x18);
  local_88[0] = *pdVar1;
  local_88[1] = pdVar1[1];
  lVar9 = *(long *)((long)&(sd2->snapshotMan_->currentSnapshot_->atomData).position.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + sd2->storage_);
  local_a8[2] = (double)*(undefined8 *)(lVar9 + 0x10 + (long)sd2->localIndex_ * 0x18);
  pdVar1 = (double *)(lVar9 + (long)sd2->localIndex_ * 0x18);
  local_a8[0] = *pdVar1;
  local_a8[1] = pdVar1[1];
  local_f8 = (double *)0x0;
  dStack_f0 = 0.0;
  local_e8[0] = 0.0;
  lVar9 = 0;
  do {
    (&local_f8)[lVar9] = (double *)(local_a8[lVar9] - local_88[lVar9]);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  local_118.super_Vector<double,_3U>.data_[2] = local_e8[0];
  local_118.super_Vector<double,_3U>.data_[0] = (double)local_f8;
  local_118.super_Vector<double,_3U>.data_[1] = dStack_f0;
  if (cVar4 != '\0') {
    Snapshot::wrapVector((this->super_GofRAngle).super_RadialDistrFunc.currentSnapshot_,&local_118);
  }
  dVar5 = 0.0;
  lVar9 = 0;
  do {
    dVar3 = local_118.super_Vector<double,_3U>.data_[lVar9];
    dVar5 = dVar5 + dVar3 * dVar3;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  lVar9 = 0;
  do {
    local_118.super_Vector<double,_3U>.data_[lVar9] =
         local_118.super_Vector<double,_3U>.data_[lVar9] / dVar5;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  OVar7 = sd1->objType_;
  if (1 < OVar7 - otDAtom) {
    (*sd1->_vptr_StuntDouble[7])(&local_f8,sd1);
    snprintf(painCave.errMsg,2000,"GofRTheta: attempted to use a non-directional object: %s\n");
    if (local_f8 != local_e8) {
      operator_delete(local_f8,(long)local_e8[0] + 1);
    }
    painCave.isFatal = 1;
    simError();
    OVar7 = sd1->objType_;
  }
  if (OVar7 < otRigidBody) {
    local_68.at_ = (AtomType *)sd1[1]._vptr_StuntDouble;
    bVar6 = MultipoleAdapter::isDipole(&local_68);
    if (bVar6) {
      lVar9 = *(long *)((long)&(sd1->snapshotMan_->currentSnapshot_->atomData).dipole.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + sd1->storage_);
      local_128 = *(undefined8 *)(lVar9 + 0x10 + (long)sd1->localIndex_ * 0x18);
      puVar2 = (undefined4 *)(lVar9 + (long)sd1->localIndex_ * 0x18);
      local_138._0_4_ = *puVar2;
      local_138._4_4_ = puVar2[1];
      uStack_130 = puVar2[2];
      uStack_12c = puVar2[3];
      goto LAB_0013814d;
    }
    padVar12 = (double (*) [3])local_60;
    StuntDouble::getA((RotMat3x3d *)padVar12,sd1);
    ppdVar8 = &local_f8;
    local_e8[4] = 0.0;
    local_e8[5] = 0.0;
    local_e8[2] = 0.0;
    local_e8[3] = 0.0;
    local_e8[0] = 0.0;
    local_e8[1] = 0.0;
    local_f8 = (double *)0x0;
    dStack_f0 = 0.0;
    local_e8[6] = 0.0;
    lVar9 = 0;
    do {
      lVar11 = 0;
      ppdVar10 = ppdVar8;
      do {
        *ppdVar10 = (double *)
                    (((SquareMatrix<double,_3> *)*padVar12)->super_RectMatrix<double,_3U,_3U>).data_
                    [0][lVar11];
        lVar11 = lVar11 + 1;
        ppdVar10 = ppdVar10 + 3;
      } while (lVar11 != 3);
      lVar9 = lVar9 + 1;
      ppdVar8 = ppdVar8 + 1;
      padVar12 = padVar12 + 1;
    } while (lVar9 != 3);
    local_158 = 0;
    uStack_150 = 0;
    local_148 = 0;
    ppdVar8 = &local_f8;
    lVar9 = 0;
    do {
      dVar5 = (double)(&local_158)[lVar9];
      lVar11 = 0;
      do {
        dVar5 = dVar5 + *(double *)((long)ppdVar8 + lVar11) *
                        *(double *)((long)&OpenMD::V3Z + lVar11);
        lVar11 = lVar11 + 8;
      } while (lVar11 != 0x18);
      (&local_158)[lVar9] = dVar5;
      lVar9 = lVar9 + 1;
      ppdVar8 = ppdVar8 + 3;
    } while (lVar9 != 3);
  }
  else {
    padVar12 = (double (*) [3])local_60;
    StuntDouble::getA((RotMat3x3d *)padVar12,sd1);
    ppdVar8 = &local_f8;
    local_e8[4] = 0.0;
    local_e8[5] = 0.0;
    local_e8[2] = 0.0;
    local_e8[3] = 0.0;
    local_e8[0] = 0.0;
    local_e8[1] = 0.0;
    local_f8 = (double *)0x0;
    dStack_f0 = 0.0;
    local_e8[6] = 0.0;
    lVar9 = 0;
    do {
      lVar11 = 0;
      ppdVar10 = ppdVar8;
      do {
        *ppdVar10 = (double *)
                    (((SquareMatrix<double,_3> *)*padVar12)->super_RectMatrix<double,_3U,_3U>).data_
                    [0][lVar11];
        lVar11 = lVar11 + 1;
        ppdVar10 = ppdVar10 + 3;
      } while (lVar11 != 3);
      lVar9 = lVar9 + 1;
      ppdVar8 = ppdVar8 + 1;
      padVar12 = padVar12 + 1;
    } while (lVar9 != 3);
    local_158 = 0;
    uStack_150 = 0;
    local_148 = 0;
    ppdVar8 = &local_f8;
    lVar9 = 0;
    do {
      dVar5 = (double)(&local_158)[lVar9];
      lVar11 = 0;
      do {
        dVar5 = dVar5 + *(double *)((long)ppdVar8 + lVar11) *
                        *(double *)((long)&OpenMD::V3Z + lVar11);
        lVar11 = lVar11 + 8;
      } while (lVar11 != 0x18);
      (&local_158)[lVar9] = dVar5;
      lVar9 = lVar9 + 1;
      ppdVar8 = ppdVar8 + 3;
    } while (lVar9 != 3);
  }
  local_128 = local_148;
  local_138._0_4_ = (undefined4)local_158;
  local_138._4_4_ = local_158._4_4_;
  uStack_130 = (undefined4)uStack_150;
  uStack_12c = uStack_150._4_4_;
LAB_0013814d:
  dVar5 = 0.0;
  lVar9 = 0;
  do {
    dVar5 = dVar5 + (double)(&local_138)[lVar9] * (double)(&local_138)[lVar9];
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  lVar9 = 0;
  do {
    (&local_138)[lVar9] = (double)(&local_138)[lVar9] / dVar5;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  dVar5 = 0.0;
  lVar9 = 0;
  do {
    dVar5 = dVar5 + local_118.super_Vector<double,_3U>.data_[lVar9] * (double)(&local_138)[lVar9];
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  return dVar5;
}

Assistant:

RealType GofRTheta::evaluateAngle(StuntDouble* sd1, StuntDouble* sd2) {
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    Vector3d pos1 = sd1->getPos();
    Vector3d pos2 = sd2->getPos();
    Vector3d r12  = pos2 - pos1;

    if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(r12);

    r12.normalize();

    Vector3d vec;

    if (!sd1->isDirectional()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "GofRTheta: attempted to use a non-directional object: %s\n",
               sd1->getType().c_str());
      painCave.isFatal = 1;
      simError();
    }

    if (sd1->isAtom()) {
      AtomType* atype1     = static_cast<Atom*>(sd1)->getAtomType();
      MultipoleAdapter ma1 = MultipoleAdapter(atype1);

      if (ma1.isDipole())
        vec = sd1->getDipole();
      else
        vec = sd1->getA().transpose() * V3Z;
    } else {
      vec = sd1->getA().transpose() * V3Z;
    }

    vec.normalize();

    return dot(r12, vec);
  }